

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

void __thiscall QRelation::populateModel(QRelation *this)

{
  long *plVar1;
  bool bVar2;
  QRelation *rel;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QRelation *in_stack_ffffffffffffff30;
  QObject *parent;
  QRelatedTableModel *this_00;
  anon_class_8_1_8991fb9c_for_o *in_stack_ffffffffffffff80;
  code *slot;
  ContextType *in_stack_ffffffffffffff88;
  ContextType *context;
  code *sender;
  offset_in_QAbstractItemModel_to_subr in_stack_ffffffffffffffb0;
  Connection local_40 [16];
  ConnectionType in_stack_ffffffffffffffd0;
  undefined1 local_28 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValid(in_stack_ffffffffffffff30);
  if ((bVar2) && (*(long *)(in_RDI + 0x48) == 0)) {
    rel = (QRelation *)operator_new(0x20);
    parent = *(QObject **)(in_RDI + 0x58);
    this_00 = (QRelatedTableModel *)&stack0xfffffffffffffff0;
    QSqlTableModel::database((QSqlTableModel *)rel);
    QRelatedTableModel::QRelatedTableModel
              (this_00,rel,parent,
               (QSqlDatabase *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    *(QRelation **)(in_RDI + 0x48) = rel;
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)parent);
    plVar1 = *(long **)(in_RDI + 0x48);
    QSqlRelation::tableName
              ((QSqlRelation *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    (**(code **)(*plVar1 + 0x1a0))(plVar1,local_28);
    QString::~QString((QString *)0x15864c);
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x1c8))();
    sender = QAbstractItemModel::dataChanged;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),QRelation::populateModel()::__0>
              ((Object *)QAbstractItemModel::dataChanged,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffffd0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd0);
    slot = QAbstractItemModel::rowsRemoved;
    context = (ContextType *)0x0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),QRelation::populateModel()::__1>
              ((Object *)sender,in_stack_ffffffffffffffb0,(ContextType *)0x0,
               (anon_class_8_1_8991fb9c_for_o *)QAbstractItemModel::rowsRemoved,
               in_stack_ffffffffffffffd0);
    QMetaObject::Connection::~Connection(local_40);
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),QRelation::populateModel()::__2>
              ((Object *)sender,in_stack_ffffffffffffffb0,context,
               (anon_class_8_1_8991fb9c_for_o *)slot,in_stack_ffffffffffffffd0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRelation::populateModel()
{
    if (!isValid())
        return;
    Q_ASSERT(m_parent != nullptr);

    if (!model) {
        model = new QRelatedTableModel(this, m_parent, m_parent->database());
        model->setTable(rel.tableName());
        model->select();
        QObject::connect(model, &QAbstractItemModel::dataChanged, model, [&](const QModelIndex &tl, const QModelIndex &br)
        {
            if (tl.column() >= col && br.column() <= col)
                clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsRemoved, model, [&]()
        {
            clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsInserted, model, [&]()
        {
            clearDictionary();
        });
    }
}